

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O0

void agent_select_result(int fd,int event)

{
  _Bool _Var1;
  agent_pending_query *conn_00;
  agent_pending_query *conn;
  int event_local;
  int fd_local;
  
  conn._0_4_ = event;
  conn._4_4_ = fd;
  if (event != 1) {
    __assert_fail("event == SELECT_R",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                  ,0x6b,"void agent_select_result(int, int)");
  }
  conn_00 = (agent_pending_query *)
            find234(agent_pending_queries,(void *)((long)&conn + 4),agent_connfind);
  if (conn_00 == (agent_pending_query *)0x0) {
    uxsel_del(conn._4_4_);
  }
  else {
    _Var1 = agent_try_read(conn_00);
    if (_Var1) {
      (*conn_00->callback)(conn_00->callback_ctx,conn_00->retbuf,conn_00->retlen);
      conn_00->retbuf = (char *)0x0;
      agent_cancel_query(conn_00);
    }
  }
  return;
}

Assistant:

static void agent_select_result(int fd, int event)
{
    agent_pending_query *conn;

    assert(event == SELECT_R);  /* not selecting for anything but R */

    conn = find234(agent_pending_queries, &fd, agent_connfind);
    if (!conn) {
        uxsel_del(fd);
        return;
    }

    if (!agent_try_read(conn))
        return;                /* more data to come */

    /*
     * We have now completed the agent query. Do the callback.
     */
    conn->callback(conn->callback_ctx, conn->retbuf, conn->retlen);
    /* Null out conn->retbuf, since ownership of that buffer has
     * passed to the callback. */
    conn->retbuf = NULL;
    agent_cancel_query(conn);
}